

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_Many_Test::~Arena_Many_Test(Arena_Many_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arena, Many) {
  memt::Arena arena;
  std::vector<std::pair<char*, char*> > allocs;

  for (size_t i = 3; i < 10; ++i) {
    for (size_t size = 0; size < 100; ++size) {
      char* a = static_cast<char*>(arena.alloc(size));
      std::pair<char*, char*> p(a, a + size);
      for (size_t j = 0; j < allocs.size(); ++j) {
        std::pair<char*, char*> p2 = allocs[j];
        if (p.first <= p2.first)
          ASSERT_FALSE(p2.first < p.second);
        else
          ASSERT_FALSE(p.first < p2.second);
      }
      std::fill(p.first, p.second, static_cast<char>(-1));
      allocs.push_back(p);
    }

    while (allocs.size() > 10 * i) {
      arena.freeTop(allocs.back().first);
      allocs.pop_back();
    }

    arena.freeAndAllAfter(allocs[5 * i].first);
    allocs.resize(5 * i);
  }
  ASSERT_FALSE(arena.isEmpty());
  arena.freeAndAllAfter(allocs.front().first);
  ASSERT_TRUE(arena.isEmpty());
}